

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O1

void __thiscall
amrex::STLtools::getIntercept
          (STLtools *this,Array<Array4<Real>,_3> *inter_arr,
          Array<Array4<const_EB2::Type_t>,_3> *type_arr,Array4<const_double> *lst,Geometry *geom,
          RunOn param_5,Box *param_6)

{
  Real *pRVar1;
  Real *pRVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  pointer pTVar26;
  pointer pXVar27;
  double *pdVar28;
  long lVar29;
  long lVar30;
  uint *puVar31;
  long lVar32;
  long lVar33;
  double *pdVar34;
  long lVar35;
  long lVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  int iVar40;
  XDim3 *pXVar41;
  ulong uVar42;
  long lVar43;
  long lVar44;
  double *pdVar45;
  double *pdVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  uint uVar50;
  int iVar51;
  long lVar52;
  long lVar53;
  Real *pRVar54;
  pointer pXVar55;
  ulong uVar56;
  uint uVar57;
  Real *pRVar58;
  bool bVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined4 uVar67;
  undefined4 uVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar73;
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  double dVar76;
  ulong uVar77;
  double dVar78;
  double dVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  long local_1a8;
  
  uVar15 = this->m_num_tri;
  uVar42 = (ulong)uVar15;
  dVar3 = (geom->prob_domain).xlo[0];
  dVar4 = (geom->prob_domain).xlo[1];
  dVar5 = (geom->prob_domain).xlo[2];
  dVar6 = (geom->super_CoordSys).dx[0];
  dVar7 = (geom->super_CoordSys).dx[1];
  dVar8 = (geom->super_CoordSys).dx[2];
  pTVar26 = (this->m_tri_pts_d).m_data;
  pXVar27 = (this->m_tri_normals_d).m_data;
  pdVar28 = lst->p;
  lVar29 = lst->jstride;
  lVar30 = lst->kstride;
  lVar48 = (long)(lst->begin).x;
  lVar49 = (long)(lst->begin).y;
  iVar16 = (lst->begin).z;
  pRVar1 = &pXVar27->z;
  pRVar2 = &(pTVar26->v3).z;
  lVar47 = 0;
  do {
    iVar17 = inter_arr->_M_elems[lVar47].begin.z;
    iVar18 = inter_arr->_M_elems[lVar47].end.z;
    if (iVar17 < iVar18) {
      iVar19 = inter_arr->_M_elems[lVar47].end.x;
      iVar20 = inter_arr->_M_elems[lVar47].end.y;
      puVar31 = type_arr->_M_elems[lVar47].p;
      lVar32 = type_arr->_M_elems[lVar47].jstride;
      lVar33 = type_arr->_M_elems[lVar47].kstride;
      iVar21 = type_arr->_M_elems[lVar47].begin.z;
      pdVar34 = inter_arr->_M_elems[lVar47].p;
      lVar35 = inter_arr->_M_elems[lVar47].jstride;
      lVar36 = inter_arr->_M_elems[lVar47].kstride;
      iVar22 = type_arr->_M_elems[lVar47].begin.y;
      iVar23 = type_arr->_M_elems[lVar47].begin.x;
      iVar24 = inter_arr->_M_elems[lVar47].begin.y;
      iVar25 = inter_arr->_M_elems[lVar47].begin.x;
      iVar40 = iVar17;
      do {
        if (iVar24 < iVar20) {
          lVar44 = (iVar40 - iVar16) * lVar30;
          dVar39 = (double)iVar40 * dVar8 + dVar5;
          dVar61 = (double)(iVar40 + 1) * dVar8 + dVar5;
          local_1a8 = (long)iVar24;
          do {
            if (iVar25 < iVar19) {
              lVar43 = (local_1a8 - lVar49) * lVar29;
              dVar62 = (double)(int)local_1a8 * dVar7 + dVar4;
              dVar37 = (double)(int)(local_1a8 + 1) * dVar7 + dVar4;
              lVar52 = (long)iVar25;
              do {
                dVar76 = NAN;
                if (puVar31[((long)iVar40 - (long)iVar21) * lVar33 +
                            (local_1a8 - iVar22) * lVar32 + (lVar52 - iVar23)] == 2) {
                  dVar38 = (double)(int)lVar52 * dVar6 + dVar3;
                  if ((int)lVar47 == 1) {
                    if ((int)uVar15 < 1) {
                      uVar50 = 0;
                      dVar76 = NAN;
                    }
                    else {
                      uVar56 = 0;
                      pRVar54 = pRVar1;
                      pRVar58 = pRVar2;
                      do {
                        dVar71 = pRVar54[-1];
                        dVar76 = 0.0;
                        bVar59 = false;
                        if ((pdVar28[lVar44 + ((local_1a8 + 1) - lVar49) * lVar29 +
                                              (lVar52 - lVar48)] -
                             pdVar28[lVar43 + lVar44 + (lVar52 - lVar48)] <= 0.0 || dVar71 <= 0.0)
                           && (0.0 <= pdVar28[lVar44 + ((local_1a8 + 1) - lVar49) * lVar29 +
                                                       (lVar52 - lVar48)] -
                                      pdVar28[lVar43 + lVar44 + (lVar52 - lVar48)] || 0.0 <= dVar71)
                           ) {
                          dVar9 = pRVar58[-7];
                          dVar10 = pRVar58[-4];
                          dVar11 = pRVar58[-1];
                          dVar60 = dVar10;
                          if (dVar10 <= dVar9) {
                            dVar60 = dVar9;
                          }
                          dVar63 = dVar11;
                          if (dVar11 <= dVar60) {
                            dVar63 = dVar60;
                          }
                          if (dVar62 <= dVar63) {
                            dVar60 = dVar10;
                            if (dVar9 <= dVar10) {
                              dVar60 = dVar9;
                            }
                            dVar63 = dVar11;
                            if (dVar60 <= dVar11) {
                              dVar63 = dVar60;
                            }
                            if (dVar63 <= dVar37) {
                              dVar60 = pRVar58[-6];
                              dVar63 = pRVar58[-3];
                              dVar12 = *pRVar58;
                              dVar13 = dVar63;
                              if (dVar63 <= dVar60) {
                                dVar13 = dVar60;
                              }
                              dVar14 = dVar12;
                              if (dVar12 <= dVar13) {
                                dVar14 = dVar13;
                              }
                              if (dVar14 < dVar39) {
                                bVar59 = false;
                                goto LAB_00766601;
                              }
                              dVar13 = dVar63;
                              if (dVar60 <= dVar63) {
                                dVar13 = dVar60;
                              }
                              dVar14 = dVar12;
                              if (dVar13 <= dVar12) {
                                dVar14 = dVar13;
                              }
                              if (dVar39 < dVar14) {
LAB_0076667e:
                                bVar59 = false;
                              }
                              else {
                                dVar13 = pRVar58[-8];
                                dVar14 = pRVar58[-5];
                                dVar70 = ((XDim3 *)(pRVar58 + -2))->x;
                                dVar79 = dVar14;
                                if (dVar14 <= dVar13) {
                                  dVar79 = dVar13;
                                }
                                dVar69 = dVar70;
                                if (dVar70 <= dVar79) {
                                  dVar69 = dVar79;
                                }
                                if (dVar38 <= dVar69) {
                                  dVar79 = dVar14;
                                  if (dVar13 <= dVar14) {
                                    dVar79 = dVar13;
                                  }
                                  dVar69 = dVar70;
                                  if (dVar79 <= dVar70) {
                                    dVar69 = dVar79;
                                  }
                                  if (dVar69 <= dVar38) {
                                    if ((dVar71 != 0.0) || (NAN(dVar71))) {
                                      dVar79 = (dVar38 - dVar14) * (dVar63 - dVar60) -
                                               (dVar14 - dVar13) * (dVar39 - dVar63);
                                      dVar69 = (dVar38 - dVar13) * (dVar60 - dVar12) -
                                               (dVar13 - dVar70) * (dVar39 - dVar60);
                                      auVar64._8_8_ = -(ulong)(ABS(dVar69) < 2.220446049250313e-16);
                                      auVar64._0_8_ = -(ulong)(ABS(dVar79) < 2.220446049250313e-16);
                                      uVar50 = movmskpd(0,auVar64);
                                      if (((uVar50 & 2) != 0) ||
                                         ((((uVar50 & 1) != 0 ||
                                           (dVar73 = (dVar38 - dVar70) * (dVar12 - dVar63) -
                                                     (dVar70 - dVar14) * (dVar39 - dVar12),
                                           ABS(dVar73) < 2.220446049250313e-16)) ||
                                          (auVar65._8_8_ =
                                                -(ulong)((double)((ulong)dVar73 & 0x8000000000000000
                                                                 | 0x3ff0000000000000) ==
                                                        (double)((ulong)dVar69 & 0x8000000000000000
                                                                | 0x3ff0000000000000)),
                                          auVar65._0_8_ =
                                               -(ulong)((double)((ulong)dVar73 & 0x8000000000000000
                                                                | 0x3ff0000000000000) ==
                                                       (double)((ulong)dVar79 & 0x8000000000000000 |
                                                               0x3ff0000000000000)),
                                          iVar51 = movmskpd(uVar50,auVar65), iVar51 == 3)))) {
                                        dVar71 = (((dVar13 + dVar14 + dVar70) * 0.3333333333333333 *
                                                   ((XDim3 *)(pRVar54 + -2))->x +
                                                  (dVar9 + dVar10 + dVar11) * 0.3333333333333333 *
                                                  dVar71 + (dVar60 + dVar63 + dVar12) *
                                                           0.3333333333333333 * *pRVar54) -
                                                 (*pRVar54 * dVar39 +
                                                 ((XDim3 *)(pRVar54 + -2))->x * dVar38)) / dVar71;
                                        bVar59 = true;
                                        dVar76 = dVar62;
                                        if (((2.220446049250313e-16 <= ABS(dVar62 - dVar71)) &&
                                            (bVar59 = true, dVar76 = dVar37,
                                            2.220446049250313e-16 <= ABS(dVar37 - dVar71))) &&
                                           (bVar59 = dVar62 < dVar71 && dVar71 < dVar37,
                                           dVar76 = dVar71, dVar62 >= dVar71 || dVar71 >= dVar37)) {
                                          dVar76 = 0.0;
                                        }
                                        goto LAB_00766601;
                                      }
                                    }
                                    goto LAB_0076667e;
                                  }
                                }
                                bVar59 = false;
                              }
                              goto LAB_00766601;
                            }
                          }
                          bVar59 = false;
                        }
LAB_00766601:
                        uVar77 = uVar56;
                        if (bVar59) break;
                        dVar76 = NAN;
                        uVar56 = uVar56 + 1;
                        pRVar54 = pRVar54 + 3;
                        pRVar58 = pRVar58 + 9;
                        uVar77 = uVar42;
                      } while (uVar42 != uVar56);
                      uVar50 = (uint)uVar77;
                    }
                    if (uVar50 == uVar15) {
                      uVar56 = -(ulong)(0.0 < pdVar28[lVar43 + lVar44 + (lVar52 - lVar48)]) &
                               (ulong)dVar62;
                      uVar77 = ~-(ulong)(0.0 < pdVar28[lVar43 + lVar44 + (lVar52 - lVar48)]) &
                               (ulong)dVar37;
LAB_00766e98:
                      dVar76 = (double)(uVar77 | uVar56);
                    }
                  }
                  else if ((int)lVar47 == 0) {
                    dVar71 = (double)(int)(lVar52 + 1) * dVar6 + dVar3;
                    if ((int)uVar15 < 1) {
                      uVar50 = 0;
                      dVar76 = NAN;
                    }
                    else {
                      lVar53 = 0;
                      uVar57 = 0;
                      pXVar55 = pXVar27;
                      do {
                        if (((0.0 < pdVar28[lVar43 + lVar44 + ((lVar52 + 1) - lVar48)] -
                                    pdVar28[lVar43 + lVar44 + (lVar52 - lVar48)]) &&
                            (0.0 < pXVar55->x)) ||
                           ((pdVar28[lVar43 + lVar44 + ((lVar52 + 1) - lVar48)] -
                             pdVar28[lVar43 + lVar44 + (lVar52 - lVar48)] < 0.0 &&
                            (pXVar55->x <= 0.0 && pXVar55->x != 0.0)))) {
LAB_00766130:
                          bVar59 = false;
                          dVar76 = 0.0;
                        }
                        else {
                          pdVar45 = (double *)((long)&(pTVar26->v1).x + lVar53);
                          dVar9 = *pdVar45;
                          dVar10 = pdVar45[3];
                          dVar76 = dVar10;
                          if (dVar10 <= dVar9) {
                            dVar76 = dVar9;
                          }
                          dVar11 = pdVar45[6];
                          uVar67 = SUB84(dVar11,0);
                          uVar68 = (undefined4)((ulong)dVar11 >> 0x20);
                          if (dVar11 <= dVar76) {
                            uVar67 = SUB84(dVar76,0);
                            uVar68 = (undefined4)((ulong)dVar76 >> 0x20);
                          }
                          if ((double)CONCAT44(uVar68,uVar67) <= dVar38 &&
                              dVar38 != (double)CONCAT44(uVar68,uVar67)) goto LAB_00766130;
                          if (dVar10 < dVar9) {
                            pdVar45 = (double *)((long)&(pTVar26->v2).x + lVar53);
                          }
                          if (dVar11 < *pdVar45) {
                            pdVar45 = (double *)((long)&(pTVar26->v3).x + lVar53);
                          }
                          if (dVar71 < *pdVar45) goto LAB_00766130;
                          dVar60 = *(double *)((long)&(pTVar26->v1).y + lVar53);
                          dVar63 = *(double *)((long)&(pTVar26->v2).y + lVar53);
                          dVar76 = dVar63;
                          if (dVar63 <= dVar60) {
                            dVar76 = dVar60;
                          }
                          dVar12 = *(double *)((long)&(pTVar26->v3).y + lVar53);
                          dVar13 = dVar12;
                          if (dVar12 <= dVar76) {
                            dVar13 = dVar76;
                          }
                          dVar76 = 0.0;
                          if (dVar13 < dVar62) {
LAB_007661c6:
                            bVar59 = false;
                          }
                          else {
                            pXVar41 = &pTVar26->v2;
                            if (dVar60 <= dVar63) {
                              pXVar41 = &pTVar26->v1;
                            }
                            pdVar45 = (double *)((long)&pXVar41->y + lVar53);
                            if (dVar12 < *pdVar45) {
                              pdVar45 = (double *)((long)&(pTVar26->v3).y + lVar53);
                            }
                            if (dVar62 < *pdVar45) goto LAB_007661c6;
                            dVar13 = *(double *)((long)&(pTVar26->v1).z + lVar53);
                            dVar14 = *(double *)((long)&(pTVar26->v2).z + lVar53);
                            dVar70 = dVar14;
                            if (dVar14 <= dVar13) {
                              dVar70 = dVar13;
                            }
                            dVar79 = *(double *)((long)&(pTVar26->v3).z + lVar53);
                            dVar69 = dVar79;
                            if (dVar79 <= dVar70) {
                              dVar69 = dVar70;
                            }
                            if (dVar39 <= dVar69) {
                              pXVar41 = &pTVar26->v2;
                              if (dVar13 <= dVar14) {
                                pXVar41 = &pTVar26->v1;
                              }
                              pdVar46 = (double *)((long)&pXVar41->z + lVar53);
                              pdVar45 = (double *)((long)&(pTVar26->v3).z + lVar53);
                              if (dVar79 < *pdVar46) {
                                pdVar46 = pdVar45;
                              }
                              if (dVar39 < *pdVar46) goto LAB_00766299;
                              dVar70 = pXVar55->x;
                              if ((dVar70 == 0.0) && (!NAN(dVar70))) goto LAB_00766299;
                              dVar69 = (dVar39 - dVar14) * (dVar63 - dVar60) -
                                       (dVar14 - dVar13) * (dVar62 - dVar63);
                              dVar73 = (dVar39 - dVar13) * (dVar60 - dVar12) -
                                       (dVar13 - dVar79) * (dVar62 - dVar60);
                              auVar74._8_8_ = -(ulong)(ABS(dVar73) < 2.220446049250313e-16);
                              auVar74._0_8_ = -(ulong)(ABS(dVar69) < 2.220446049250313e-16);
                              uVar50 = movmskpd((int)pdVar45,auVar74);
                              if (((uVar50 & 2) == 0) &&
                                 ((((uVar50 & 1) == 0 &&
                                   (dVar78 = (dVar39 - dVar79) * (dVar12 - dVar63) -
                                             (dVar79 - dVar14) * (dVar62 - dVar12),
                                   2.220446049250313e-16 <= ABS(dVar78))) &&
                                  (auVar72._0_8_ = (ulong)dVar69 & 0x8000000000000000,
                                  auVar72._8_8_ = (ulong)dVar73 & 0x8000000000000000,
                                  auVar80._0_8_ = (ulong)dVar78 & 0x8000000000000000,
                                  auVar80._8_8_ = (ulong)dVar78 & 0x8000000000000000,
                                  auVar81._8_8_ =
                                       -(ulong)(SUB168(auVar80 | _DAT_0078ba10,8) ==
                                               SUB168(auVar72 | _DAT_0078ba10,8)),
                                  auVar81._0_8_ =
                                       -(ulong)(SUB168(auVar80 | _DAT_0078ba10,0) ==
                                               SUB168(auVar72 | _DAT_0078ba10,0)),
                                  iVar51 = movmskpd(uVar50,auVar81), iVar51 != 3))))
                              goto LAB_00766299;
                              dVar70 = (((dVar13 + dVar14 + dVar79) * 0.3333333333333333 *
                                         pXVar55->z +
                                        (dVar9 + dVar10 + dVar11) * 0.3333333333333333 * dVar70 +
                                        (dVar60 + dVar63 + dVar12) * 0.3333333333333333 * pXVar55->y
                                        ) - (pXVar55->y * dVar62 + pXVar55->z * dVar39)) / dVar70;
                              bVar59 = true;
                              dVar76 = dVar38;
                              if (((2.220446049250313e-16 <= ABS(dVar38 - dVar70)) &&
                                  (bVar59 = true, dVar76 = dVar71,
                                  2.220446049250313e-16 <= ABS(dVar71 - dVar70))) &&
                                 (bVar59 = dVar38 < dVar70 && dVar70 < dVar71, dVar76 = dVar70,
                                 dVar38 >= dVar70 || dVar70 >= dVar71)) {
                                dVar76 = 0.0;
                              }
                            }
                            else {
LAB_00766299:
                              bVar59 = false;
                            }
                          }
                        }
                        uVar50 = uVar57;
                        if (bVar59) break;
                        uVar57 = uVar57 + 1;
                        lVar53 = lVar53 + 0x48;
                        pXVar55 = pXVar55 + 1;
                        uVar50 = uVar15;
                        dVar76 = NAN;
                      } while (uVar42 * 0x48 != lVar53);
                    }
                    if (uVar50 == uVar15) {
                      dVar76 = (double)(~-(ulong)(0.0 < pdVar28[lVar43 + lVar44 + (lVar52 - lVar48)]
                                                 ) & (ulong)dVar71 |
                                       (ulong)dVar38 &
                                       -(ulong)(0.0 < pdVar28[lVar43 + lVar44 + (lVar52 - lVar48)]))
                      ;
                    }
                  }
                  else {
                    if ((int)uVar15 < 1) {
                      uVar50 = 0;
                      dVar76 = NAN;
                    }
                    else {
                      uVar56 = 0;
                      pRVar54 = pRVar1;
                      pRVar58 = pRVar2;
                      do {
                        dVar71 = *pRVar54;
                        dVar76 = 0.0;
                        bVar59 = false;
                        if ((pdVar28[lVar43 + (lVar52 - lVar48) + ((iVar40 + 1) - iVar16) * lVar30]
                             - pdVar28[lVar43 + (lVar52 - lVar48) + lVar44] <= 0.0 || dVar71 <= 0.0)
                           && (0.0 <= pdVar28[lVar43 + (lVar52 - lVar48) +
                                                       ((iVar40 + 1) - iVar16) * lVar30] -
                                      pdVar28[lVar43 + (lVar52 - lVar48) + lVar44] || 0.0 <= dVar71)
                           ) {
                          dVar9 = pRVar58[-6];
                          dVar10 = pRVar58[-3];
                          dVar11 = *pRVar58;
                          dVar60 = dVar10;
                          if (dVar10 <= dVar9) {
                            dVar60 = dVar9;
                          }
                          dVar63 = dVar11;
                          if (dVar11 <= dVar60) {
                            dVar63 = dVar60;
                          }
                          if (dVar39 <= dVar63) {
                            dVar60 = dVar10;
                            if (dVar9 <= dVar10) {
                              dVar60 = dVar9;
                            }
                            dVar63 = dVar11;
                            if (dVar60 <= dVar11) {
                              dVar63 = dVar60;
                            }
                            if (dVar63 <= dVar61) {
                              dVar60 = pRVar58[-8];
                              dVar63 = pRVar58[-5];
                              dVar12 = ((XDim3 *)(pRVar58 + -2))->x;
                              dVar13 = dVar63;
                              if (dVar63 <= dVar60) {
                                dVar13 = dVar60;
                              }
                              dVar14 = dVar12;
                              if (dVar12 <= dVar13) {
                                dVar14 = dVar13;
                              }
                              if (dVar38 <= dVar14) {
                                dVar13 = dVar63;
                                if (dVar60 <= dVar63) {
                                  dVar13 = dVar60;
                                }
                                dVar14 = dVar12;
                                if (dVar13 <= dVar12) {
                                  dVar14 = dVar13;
                                }
                                if (dVar14 <= dVar38) {
                                  dVar13 = pRVar58[-7];
                                  dVar14 = pRVar58[-4];
                                  dVar70 = pRVar58[-1];
                                  dVar79 = dVar14;
                                  if (dVar14 <= dVar13) {
                                    dVar79 = dVar13;
                                  }
                                  dVar69 = dVar70;
                                  if (dVar70 <= dVar79) {
                                    dVar69 = dVar79;
                                  }
                                  if (dVar62 <= dVar69) {
                                    dVar79 = dVar14;
                                    if (dVar13 <= dVar14) {
                                      dVar79 = dVar13;
                                    }
                                    dVar69 = dVar70;
                                    if (dVar79 <= dVar70) {
                                      dVar69 = dVar79;
                                    }
                                    if ((dVar69 <= dVar62) && ((dVar71 != 0.0 || (NAN(dVar71))))) {
                                      dVar79 = (dVar62 - dVar14) * (dVar63 - dVar60) -
                                               (dVar14 - dVar13) * (dVar38 - dVar63);
                                      dVar69 = (dVar62 - dVar13) * (dVar60 - dVar12) -
                                               (dVar13 - dVar70) * (dVar38 - dVar60);
                                      auVar66._8_8_ = -(ulong)(ABS(dVar69) < 2.220446049250313e-16);
                                      auVar66._0_8_ = -(ulong)(ABS(dVar79) < 2.220446049250313e-16);
                                      uVar50 = movmskpd(0,auVar66);
                                      if (((uVar50 & 2) != 0) ||
                                         ((((uVar50 & 1) != 0 ||
                                           (dVar73 = (dVar62 - dVar70) * (dVar12 - dVar63) -
                                                     (dVar70 - dVar14) * (dVar38 - dVar12),
                                           ABS(dVar73) < 2.220446049250313e-16)) ||
                                          (auVar75._8_8_ =
                                                -(ulong)((double)((ulong)dVar73 & DAT_0077bb00._8_8_
                                                                 | 0x3ff0000000000000) ==
                                                        (double)((ulong)dVar69 & DAT_0077bb00._8_8_
                                                                | 0x3ff0000000000000)),
                                          auVar75._0_8_ =
                                               -(ulong)((double)((ulong)dVar73 & (ulong)DAT_0077bb00
                                                                | 0x3ff0000000000000) ==
                                                       (double)((ulong)dVar79 & (ulong)DAT_0077bb00
                                                               | 0x3ff0000000000000)),
                                          iVar51 = movmskpd(uVar50,auVar75), iVar51 == 3)))) {
                                        dVar71 = (((dVar13 + dVar14 + dVar70) * 0.3333333333333333 *
                                                   pRVar54[-1] +
                                                  (dVar9 + dVar10 + dVar11) * 0.3333333333333333 *
                                                  dVar71 + (dVar60 + dVar63 + dVar12) *
                                                           0.3333333333333333 *
                                                           ((XDim3 *)(pRVar54 + -2))->x) -
                                                 (((XDim3 *)(pRVar54 + -2))->x * dVar38 +
                                                 pRVar54[-1] * dVar62)) / dVar71;
                                        bVar59 = true;
                                        dVar76 = dVar39;
                                        if (((2.220446049250313e-16 <= ABS(dVar39 - dVar71)) &&
                                            (bVar59 = true, dVar76 = dVar61,
                                            2.220446049250313e-16 <= ABS(dVar61 - dVar71))) &&
                                           (bVar59 = dVar39 < dVar71 && dVar71 < dVar61,
                                           dVar76 = dVar71, dVar39 >= dVar71 || dVar71 >= dVar61)) {
                                          dVar76 = 0.0;
                                        }
                                        goto LAB_00766b1f;
                                      }
                                    }
                                  }
                                }
                              }
                              bVar59 = false;
                              goto LAB_00766b1f;
                            }
                          }
                          bVar59 = false;
                        }
LAB_00766b1f:
                        uVar77 = uVar56;
                        if (bVar59) break;
                        dVar76 = NAN;
                        uVar56 = uVar56 + 1;
                        pRVar54 = pRVar54 + 3;
                        pRVar58 = pRVar58 + 9;
                        uVar77 = uVar42;
                      } while (uVar42 != uVar56);
                      uVar50 = (uint)uVar77;
                    }
                    if (uVar50 == uVar15) {
                      uVar56 = -(ulong)(0.0 < pdVar28[lVar43 + lVar44 + (lVar52 - lVar48)]) &
                               (ulong)dVar39;
                      uVar77 = ~-(ulong)(0.0 < pdVar28[lVar43 + lVar44 + (lVar52 - lVar48)]) &
                               (ulong)dVar61;
                      goto LAB_00766e98;
                    }
                  }
                }
                pdVar34[(iVar40 - iVar17) * lVar36 +
                        (local_1a8 - iVar24) * lVar35 + (lVar52 - iVar25)] = dVar76;
                lVar52 = lVar52 + 1;
              } while (iVar19 != (int)lVar52);
            }
            local_1a8 = local_1a8 + 1;
          } while (iVar20 != (int)local_1a8);
        }
        bVar59 = iVar40 != iVar18 + -1;
        iVar40 = iVar40 + 1;
      } while (bVar59);
    }
    lVar47 = lVar47 + 1;
    if (lVar47 == 3) {
      return;
    }
  } while( true );
}

Assistant:

void
STLtools::getIntercept (Array<Array4<Real>,AMREX_SPACEDIM> const& inter_arr,
                        Array<Array4<EB2::Type_t const>,AMREX_SPACEDIM> const& type_arr,
                        Array4<Real const> const& lst ,Geometry const& geom,
                        RunOn, Box const&) const
{
    int num_triangles = m_num_tri;

    const auto plo = geom.ProbLoArray();
    const auto dx  = geom.CellSizeArray();

    const Triangle* tri_pts = m_tri_pts_d.data();
    const XDim3* tri_norm = m_tri_normals_d.data();

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        Array4<Real> const& inter = inter_arr[idim];
        Array4<EB2::Type_t const> const& type = type_arr[idim];
        const Box bx{inter};
        ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real r = std::numeric_limits<Real>::quiet_NaN();
            if (type(i,j,k) == EB2::Type::irregular) {
                XDim3 p1{plo[0]+i*dx[0],
                         plo[1]+j*dx[1],
#if (AMREX_SPACEDIM == 2)
                         Real(0.)
#else
                         plo[2]+k*dx[2]
#endif
                };
                if (idim == 0) {
                    Real x2 = plo[0]+(i+1)*dx[0];
                    int it;
                    for (it=0; it < num_triangles; ++it) {
                        auto const& tri = tri_pts[it];
                        auto tmp = edge_tri_intersects(p1.x, x2, p1.y, p1.z,
                                                       tri.v1, tri.v2, tri.v3,
                                                       tri_norm[it],
                                                       lst(i+1,j,k)-lst(i,j,k));
                        if (tmp.first) {
                            r = tmp.second;
                            break;
                        }
                    }
                    if (it == num_triangles) {
                        r = (lst(i,j,k) > 0._rt) ? p1.x : x2;
                    }
                } else if (idim == 1) {
                    Real y2 = plo[1]+(j+1)*dx[1];
                    int it;
                    for (it=0; it < num_triangles; ++it) {
                        auto const& tri = tri_pts[it];
                        auto const& norm = tri_norm[it];
                        auto tmp = edge_tri_intersects(p1.y, y2, p1.z, p1.x,
                                                       {tri.v1.y, tri.v1.z, tri.v1.x},
                                                       {tri.v2.y, tri.v2.z, tri.v2.x},
                                                       {tri.v3.y, tri.v3.z, tri.v3.x},
                                                       {  norm.y,   norm.z,   norm.x},
                                                       lst(i,j+1,k)-lst(i,j,k));
                        if (tmp.first) {
                            r = tmp.second;
                            break;
                        }
                    }
                    if (it == num_triangles) {
                        r = (lst(i,j,k) > 0._rt) ? p1.y : y2;
                    }
                } else {
                    Real z2 = plo[2]+(k+1)*dx[2];
                    int it;
                    for (it=0; it < num_triangles; ++it) {
                        auto const& tri = tri_pts[it];
                        auto const& norm = tri_norm[it];
                        auto tmp = edge_tri_intersects(p1.z, z2, p1.x, p1.y,
                                                       {tri.v1.z, tri.v1.x, tri.v1.y},
                                                       {tri.v2.z, tri.v2.x, tri.v2.y},
                                                       {tri.v3.z, tri.v3.x, tri.v3.y},
                                                       {  norm.z,   norm.x,   norm.y},
                                                       lst(i,j,k+1)-lst(i,j,k));
                        if (tmp.first) {
                            r = tmp.second;
                            break;
                        }
                    }
                    if (it == num_triangles) {
                        r = (lst(i,j,k) > 0._rt) ? p1.z : z2;
                    }
                }
            }
            inter(i,j,k) = r;
        });
    }
}